

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

int canvas_path_iterate(_glist *x,t_canvas_path_iterator fun,void *user_data)

{
  char *__src;
  int iVar1;
  t_symbol *ptVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  t_namelist *ptVar6;
  _glist *x_00;
  char realname [1000];
  char local_418 [997];
  undefined1 local_33;
  undefined1 local_31;
  
  if (fun == (t_canvas_path_iterator)0x0) {
    return 0;
  }
  iVar4 = 0;
  for (x_00 = x; x_00 != (_glist *)0x0; x_00 = x_00->gl_owner) {
    if (x_00->gl_env != (_canvasenvironment *)0x0) {
      ptVar2 = canvas_getdir(x_00);
      pcVar5 = ptVar2->s_name;
      ptVar6 = (t_namelist *)&x_00->gl_env->ce_path;
      while (ptVar6 = ptVar6->nl_next, ptVar6 != (t_namelist *)0x0) {
        iVar1 = sys_isabsolutepath(ptVar6->nl_string);
        if (iVar1 == 0) {
          strncpy(local_418,pcVar5,1000);
          local_33 = 0;
          sVar3 = strlen(local_418);
          (local_418 + sVar3)[0] = '/';
          (local_418 + sVar3)[1] = '\0';
        }
        else {
          local_418[0] = '\0';
        }
        __src = ptVar6->nl_string;
        sVar3 = strlen(local_418);
        strncat(local_418,__src,1000 - sVar3);
        local_31 = 0;
        iVar1 = (*fun)(local_418,user_data);
        iVar4 = iVar4 + 1;
        if (iVar1 == 0) {
          return iVar4;
        }
      }
    }
  }
  if (x == (_glist *)0x0) {
    pcVar5 = ".";
  }
  else {
    ptVar2 = canvas_getdir(x);
    pcVar5 = ptVar2->s_name;
  }
  iVar1 = (*fun)(pcVar5,user_data);
  if (iVar1 != 0) {
    ptVar6 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_searchpath;
    iVar4 = iVar4 + 1;
    do {
      ptVar6 = ptVar6->nl_next;
      if (ptVar6 == (t_namelist *)0x0) {
        ptVar6 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_temppath;
        do {
          ptVar6 = ptVar6->nl_next;
          if (ptVar6 == (t_namelist *)0x0) {
            if (sys_usestdpath == 0) {
              return iVar4;
            }
            ptVar6 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
            do {
              ptVar6 = ptVar6->nl_next;
              if (ptVar6 == (t_namelist *)0x0) {
                return iVar4;
              }
              iVar1 = (*fun)(ptVar6->nl_string,user_data);
              iVar4 = iVar4 + 1;
            } while (iVar1 != 0);
            return iVar4;
          }
          iVar1 = (*fun)(ptVar6->nl_string,user_data);
          iVar4 = iVar4 + 1;
        } while (iVar1 != 0);
        return iVar4;
      }
      iVar1 = (*fun)(ptVar6->nl_string,user_data);
      iVar4 = iVar4 + 1;
    } while (iVar1 != 0);
    return iVar4;
  }
  return iVar4 + 1;
}

Assistant:

int canvas_path_iterate(const t_canvas *x, t_canvas_path_iterator fun,
    void *user_data)
{
    const t_canvas *y = 0;
    t_namelist *nl = 0;
    int count = 0;
    if (!fun)
        return 0;
        /* iterate through canvas-local paths */
    for (y = x; y; y = y->gl_owner)
        if (y->gl_env)
    {
        const char *dir;
        dir = canvas_getdir(y)->s_name;
        for (nl = y->gl_env->ce_path; nl; nl = nl->nl_next)
        {
            char realname[MAXPDSTRING];
            if (sys_isabsolutepath(nl->nl_string))
                realname[0] = '\0';
            else
            {   /* if not absolute path, append Pd lib dir */
                strncpy(realname, dir, MAXPDSTRING);
                realname[MAXPDSTRING-3] = 0;
                strcat(realname, "/");
            }
            strncat(realname, nl->nl_string, MAXPDSTRING-strlen(realname));
            realname[MAXPDSTRING-1] = 0;
            if (!fun(realname, user_data))
                return count+1;
            count++;
        }
    }
    /* try canvas dir */
    if (!fun((x ? canvas_getdir(x)->s_name : "."), user_data))
        return count+1;
    count++;

    /* now iterate through the global paths */
    for (nl = STUFF->st_searchpath; nl; nl = nl->nl_next)
    {
        if (!fun(nl->nl_string, user_data))
            return count+1;
        count++;
    }
    /* and the temp paths from the commandline */
    for (nl = STUFF->st_temppath; nl; nl = nl->nl_next)
    {
        if (!fun(nl->nl_string, user_data))
            return count+1;
        count++;
    }
    /* and the default paths */
    if (sys_usestdpath)
        for (nl = STUFF->st_staticpath; nl; nl = nl->nl_next)
        {
            if (!fun(nl->nl_string, user_data))
                return count+1;
            count++;
        }

    return count;
}